

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O3

void __thiscall cfd::core::ScriptHash::ScriptHash(ScriptHash *this,string *script_hash)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  this->_vptr_ScriptHash = (_func_int **)&PTR__ScriptHash_00687de0;
  StringUtil::StringToByte(&local_28,(string *)script_hash);
  ByteData::ByteData(&this->script_hash_,&local_28);
  if (local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

ScriptHash::ScriptHash(const std::string& script_hash)
    : script_hash_(StringUtil::StringToByte(script_hash)) {
  // do nothing
}